

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImageView.h
# Opt level: O0

ImageView * __thiscall ZXing::ImageView::rotated(ImageView *this,int degree)

{
  undefined4 uVar1;
  int iVar2;
  int in_EDX;
  ImageView *in_RSI;
  ImageView *in_RDI;
  int in_stack_00000008;
  ImageFormat in_stack_0000000c;
  int in_stack_00000010;
  int in_stack_00000014;
  uint8_t *in_stack_00000018;
  ImageView *in_stack_00000020;
  
  iVar2 = (int)((ulong)((long)(in_EDX + 0x168) * -0x49f49f49) >> 0x20) + 0x168 + in_EDX;
  iVar2 = in_EDX + 0x168 + ((iVar2 >> 8) - (iVar2 >> 0x1f)) * -0x168;
  if (iVar2 == 0x5a) {
    data(in_RSI,0,in_RSI->_height + -1);
    ImageView(in_stack_00000020,in_stack_00000018,in_stack_00000014,in_stack_00000010,
              in_stack_0000000c,in_stack_00000008,(int)this);
  }
  else if (iVar2 == 0xb4) {
    data(in_RSI,in_RSI->_width + -1,in_RSI->_height + -1);
    ImageView(in_stack_00000020,in_stack_00000018,in_stack_00000014,in_stack_00000010,
              in_stack_0000000c,in_stack_00000008,(int)this);
  }
  else if (iVar2 == 0x10e) {
    data(in_RSI,in_RSI->_width + -1,0);
    ImageView(in_stack_00000020,in_stack_00000018,in_stack_00000014,in_stack_00000010,
              in_stack_0000000c,in_stack_00000008,(int)this);
  }
  else {
    in_RDI->_data = in_RSI->_data;
    iVar2 = in_RSI->_width;
    in_RDI->_format = in_RSI->_format;
    in_RDI->_width = iVar2;
    iVar2 = in_RSI->_pixStride;
    in_RDI->_height = in_RSI->_height;
    in_RDI->_pixStride = iVar2;
    uVar1 = *(undefined4 *)&in_RSI->field_0x1c;
    in_RDI->_rowStride = in_RSI->_rowStride;
    *(undefined4 *)&in_RDI->field_0x1c = uVar1;
  }
  return in_RDI;
}

Assistant:

ImageView rotated(int degree) const
	{
		switch ((degree + 360) % 360) {
		case 90:  return {data(0, _height - 1), _height, _width, _format, _pixStride, -_rowStride};
		case 180: return {data(_width - 1, _height - 1), _width, _height, _format, -_rowStride, -_pixStride};
		case 270: return {data(_width - 1, 0), _height, _width, _format, -_pixStride, _rowStride};
		}
		return *this;
	}